

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_rawseti(lua_State *L,int idx,int n)

{
  uint uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  ulong uVar4;
  GCobj *o;
  GCtab *t;
  
  pTVar3 = index2adr(L,idx);
  uVar1 = (pTVar3->u32).lo;
  t = (GCtab *)(ulong)uVar1;
  if ((uint)n < t->asize) {
    pTVar3 = (TValue *)((ulong)(t->array).ptr32 + (long)n * 8);
  }
  else {
    pTVar3 = lj_tab_setinth(L,t,n);
  }
  pTVar2 = L->top;
  *pTVar3 = pTVar2[-1];
  if ((((pTVar3->field_2).it + 0xd < 9) && ((*(byte *)((ulong)(pTVar3->u32).lo + 4) & 3) != 0)) &&
     ((t->marked & 4) != 0)) {
    uVar4 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar4 + 0x6c);
    *(uint *)(uVar4 + 0x6c) = uVar1;
  }
  L->top = pTVar2 + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti(lua_State *L, int idx, int n)
{
  GCtab *t = tabV(index2adr(L, idx));
  TValue *dst, *src;
  lj_checkapi_slot(1);
  dst = lj_tab_setint(L, t, n);
  src = L->top-1;
  copyTV(L, dst, src);
  lj_gc_barriert(L, t, dst);
  L->top = src;
}